

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exr_io.cpp
# Opt level: O0

void LoadEXR_RGBA(float **rgba,int *width,int *height,char *filename)

{
  int iVar1;
  undefined8 *puVar2;
  int ret;
  char *err;
  char **in_stack_000108b8;
  char *in_stack_000108c0;
  int *in_stack_000108c8;
  int *in_stack_000108d0;
  float **in_stack_000108d8;
  
  iVar1 = LoadEXR(in_stack_000108d8,in_stack_000108d0,in_stack_000108c8,in_stack_000108c0,
                  in_stack_000108b8);
  if (iVar1 != 0) {
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar2 = "LoadEXR unknown error";
    __cxa_throw(puVar2,&char_const*::typeinfo,0);
  }
  return;
}

Assistant:

void LoadEXR_RGBA(float** rgba, int* width, int* height, const char* filename)
{
  const char* err = NULL;
  int ret = LoadEXR(rgba, width, height, filename, &err);
  if (ret != TINYEXR_SUCCESS) {
    if (err) {
      throw err;
    }
    else {
      throw "LoadEXR unknown error";
    }
  }
}